

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

int __thiscall Clasp::Cli::ClaspCliConfig::getValue(ClaspCliConfig *this,KeyType key,string *out)

{
  float fVar1;
  Integration IVar2;
  Policy PVar3;
  ulong uVar4;
  UserConfig *pUVar5;
  undefined4 uVar7;
  uint *puVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 extraout_var;
  RestartSchedule *num;
  ulong uVar12;
  StringRef *pSVar13;
  uint *y;
  uint uVar14;
  Set<Clasp::SolverParams::Forget> *num_00;
  char **in_R8;
  ClaspCliConfig *pCVar15;
  Set<Clasp::HeuParams::DomMod> mod;
  undefined4 uStack_64;
  Set<Clasp::HeuParams::DomPref> pick;
  StringRef str;
  CCMinType local_38;
  Type local_34;
  ulong *puVar11;
  undefined4 extraout_var_00;
  
  pCVar15 = (ClaspCliConfig *)(this->super_ClaspConfig).tester_;
  if ((key >> 0x19 & 1) == 0) {
    pCVar15 = this;
  }
  if (pCVar15 == (ClaspCliConfig *)0x0 || 0x48 < (ushort)key) {
    return -1;
  }
  uVar14 = (key & 0x7f) - 1;
  if (0x47 < uVar14) {
    if ((ushort)key == 0) {
      uVar14 = (uint)(pCVar15->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.cliConfig
      ;
      if (uVar14 < 0x14) {
        str.out = (string *)enumMap(Clasp::Cli::ConfigKey_const*)::map;
        Potassco::findKey((Span<Potassco::KV> *)&str,uVar14);
        std::__cxx11::string::append((char *)out);
      }
      else {
        std::__cxx11::string::append((string *)out);
      }
    }
    goto LAB_001208fb;
  }
  if ((pCVar15 != this) && ((0x35 < uVar14 || (0xfffffffc < (key & 0x7f) - 7)))) {
    Potassco::fail(-1,"int Clasp::Cli::ClaspCliConfig::getValue(KeyType, std::string &) const",0x3a8
                   ,"base == this || isTesterOption(o)",(char *)0x0);
  }
  uVar12 = (ulong)(key >> 0x10) & 0xff;
  iVar10 = (*(pCVar15->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
             super_Configuration._vptr_Configuration[6])(pCVar15,uVar12);
  puVar11 = (ulong *)CONCAT44(extraout_var,iVar10);
  iVar10 = (*(pCVar15->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.
             super_Configuration._vptr_Configuration[7])(pCVar15,uVar12);
  num = (RestartSchedule *)CONCAT44(extraout_var_00,iVar10);
  uVar9 = uStack_64;
  str.out = out;
  switch(key & 0xffff) {
  case 1:
    _mod = (char *)(CONCAT44(uVar9,(uint)(byte)(pCVar15->super_ClaspConfig).super_BasicSatConfig.
                                               super_ContextParams.field_0x8) & 0xffffffff00000007);
    Potassco::string_cast<Clasp::ContextParams::ShareMode>((string *)&str,&mod.val);
    break;
  case 2:
    _mod = (char *)(CONCAT71(stack0xffffffffffffff99,
                             (byte)(pCVar15->super_ClaspConfig).super_BasicSatConfig.
                                   super_ContextParams.field_0x8 >> 5) & 0xffffffffffffff01);
    Potassco::string_cast<unsigned_char>((string *)&str,(uchar *)&mod);
    break;
  case 3:
    Potassco::string_cast<Clasp::SatPreParams>
              ((string *)&str,
               &(pCVar15->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.satPre);
    break;
  case 4:
    pUVar5 = (this->super_ClaspConfig).tester_;
    if ((pUVar5 == (UserConfig *)0x0) || (((pUVar5->super_ContextParams).field_0x8 & 0x18) == 0)) {
      _mod = (char *)(CONCAT71(stack0xffffffffffffff99,
                               (byte)(this->super_ClaspConfig).super_BasicSatConfig.
                                     super_ContextParams.field_0x8 >> 3) & 0xffffffffffffff03);
      Potassco::operator<<(&str,(uchar *)&mod);
    }
    else {
      pick.val = CONCAT31(pick.val._1_3_,
                          (byte)(this->super_ClaspConfig).super_BasicSatConfig.super_ContextParams.
                                field_0x8 >> 3) & 0xffffff03;
      pSVar13 = Potassco::operator<<(&str,(uchar *)&pick);
      local_38 = CONCAT31(local_38._1_3_,
                          (byte)(((this->super_ClaspConfig).tester_)->super_ContextParams).field_0x8
                          >> 3) & 0xffffff03;
      Potassco::operator<<(pSVar13,(uchar *)&local_38);
    }
    goto LAB_001208fb;
  case 5:
    _mod = (char *)CONCAT71(stack0xffffffffffffff99,
                            ((this->super_ClaspConfig).parse.set & 0x3f) != 0);
    Potassco::string_cast<bool>((string *)&str,(bool *)&mod);
    break;
  case 6:
    _mod = (char *)CONCAT71(stack0xffffffffffffff99,(this->super_ClaspConfig).parse.set >> 7);
    Potassco::string_cast<bool>((string *)&str,(bool *)&mod);
    break;
  case 7:
    Potassco::string_cast<Clasp::OptParams>((string *)&str,(OptParams *)(puVar11 + 2));
    break;
  case 8:
    uVar14 = (uint)puVar11[2];
    if ((uVar14 & 0xe0) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar14 >> 5) & 0xffffffff00000007);
      pick.val = uVar14 >> 0xc & 0x1f;
      Potassco::toString<Clasp::OptParams::UscTrim,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(ulong)(uVar14 >> 5 & 7));
    }
    break;
  case 9:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[2] >> 1) & 0xffffffff00000003);
    Potassco::string_cast<Potassco::Set<Clasp::OptParams::Heuristic>>
              ((string *)&str,(Potassco *)&mod,(Set<Clasp::OptParams::Heuristic> *)num_00);
    break;
  case 10:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x34)) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0xb:
    uVar14 = (uint)puVar11[3];
    if ((uVar14 & 0x30000) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar14 >> 0x10) & 0xffffffff00000003);
      pick.val = uVar14 & 0xffff;
      Potassco::toString<Clasp::Var_t::Type,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(ulong)(uVar14 >> 0x10 & 3));
    }
    break;
  case 0xc:
    _mod = (char *)(CONCAT44(uVar9,*(undefined4 *)((long)puVar11 + 4)) & 0xffffffff00000007);
    pick.val = (uint)(ushort)puVar11[1];
    Potassco::toString<Clasp::Heuristic_t::Type,unsigned_int>
              ((string *)&str,(Potassco *)&mod,&pick.val,&switchD_0011fb21::switchdataD_001972e4);
    break;
  case 0xd:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[1] >> 0x14) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0xe:
    _mod = (char *)(CONCAT44(uVar9,(uint)*(ushort *)((long)puVar11 + 10)) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::HeuParams::Score>((string *)&str,&mod.val);
    break;
  case 0xf:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[1] >> 0x12) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::HeuParams::ScoreOther>((string *)&str,&mod.val);
    break;
  case 0x10:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x35)) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::SolverStrategies::SignHeu>((string *)&str,&mod.val);
    break;
  case 0x11:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x37)) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x12:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[1] >> 0x16) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x13:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[1] >> 0x17) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x14:
    uVar14 = *(uint *)((long)puVar11 + 0xc);
    if ((uVar14 & 0x3ff) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar14) & 0xffffffff000003ff);
      pick.val = uVar14 >> 10 & 0x7f;
      local_38 = uVar14 >> 0x11;
      Potassco::toString<unsigned_int,unsigned_int,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,&local_38,(uint *)in_R8);
    }
    break;
  case 0x15:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[1] >> 0x15) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x16:
    uVar14 = (uint)puVar11[1];
    _mod = (char *)CONCAT44(uVar9,uVar14 >> 0x1d);
    pick.val = uVar14 >> 0x18 & 0x1f;
    if (pick.val == 0 || uVar14 < 0x20000000) {
      Potassco::operator<<(&str,&mod);
    }
    else {
      pSVar13 = Potassco::operator<<(&str,&mod);
      Potassco::operator<<(pSVar13,&pick);
    }
    goto LAB_001208fb;
  case 0x17:
    _mod = (char *)CONCAT44(uVar9,(uint)*(ushort *)((long)puVar11 + 2));
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x18:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x2f)) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::SolverStrategies::WatchInit>((string *)&str,&mod.val);
    break;
  case 0x19:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x31)) & 0xffffffff00000001);
    Potassco::string_cast<Clasp::SolverStrategies::UpdateMode>((string *)&str,&mod.val);
    break;
  case 0x1a:
    _mod = (char *)CONCAT44(uVar9,(uint)(((uint)puVar11[3] >> 0x14 & 1) == 0));
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x1b:
    Potassco::string_cast<unsigned_int>((string *)&str,(uint *)((long)puVar11 + 0x14));
    break;
  case 0x1c:
    _mod = (char *)(CONCAT71(stack0xffffffffffffff99,(char)(*puVar11 >> 0x33)) & 0xffffffffffffff01)
    ;
    Potassco::string_cast<bool>((string *)&str,(bool *)&mod);
    break;
  case 0x1d:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[3] >> 0x15) & 0xffffffff0000000f);
    Potassco::string_cast<Potassco::Set<Clasp::SolverParams::Forget>>
              ((string *)&str,(Potassco *)&mod,num_00);
    break;
  case 0x1e:
    uVar12 = *puVar11;
    if ((~uVar12 & 0x60000000000) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      uVar14 = (uint)(uVar12 >> 0x20);
      pick.val = uVar14 >> 0xd & 1;
      local_38 = uVar14 >> 9 & 3;
      _mod = "no";
      if ((uVar12 >> 0x2e & 1) == 0) {
        _mod = "yes";
      }
      Potassco::
      toString<Clasp::SolverStrategies::CCMinType,Clasp::SolverStrategies::CCMinAntes,char_const*>
                ((string *)&str,(Potassco *)&pick,&local_38,&mod.val,in_R8);
    }
    break;
  case 0x1f:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x25)) & 0xffffffff00000003);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x20:
    if ((*puVar11 & 0x18000000000) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x27)) & 0xffffffff00000003);
      pick.val = *(uint *)&num[4].super_ScheduleStrategy & 0x7f;
      Potassco::toString<Clasp::SolverStrategies::LbdMode,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)0x18000000000);
    }
    break;
  case 0x21:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x32)) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x22:
    _mod = (char *)(CONCAT44(uVar9,(uint)(*puVar11 >> 0x23)) & 0xffffffff00000003);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x23:
    uVar12 = *puVar11;
    if ((short)uVar12 == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)CONCAT44(uVar9,(int)(CCRepMode *)(uVar12 & 0xffff));
      pick.val = (uint)(uVar12 >> 0x2b) & 3;
      Potassco::toString<unsigned_int,Clasp::SolverStrategies::CCRepMode>
                ((string *)&str,(Potassco *)&mod,&pick.val,(CCRepMode *)(uVar12 & 0xffff));
    }
    break;
  case 0x24:
    _mod = (char *)(CONCAT44(uVar9,(uint)puVar11[3] >> 0x12) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::DefaultUnfoundedCheck::ReasonStrategy>((string *)&str,&mod.val);
    break;
  case 0x25:
    uVar14 = num[6].super_ScheduleStrategy.len;
    if ((uVar14 & 0x7f000000) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar14 >> 0x18) & 0xffffffff0000007f);
      pick.val = uVar14 & 0xffffff;
      Potassco::toString<unsigned_int,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(ulong)(uVar14 >> 0x18 & 0x7f));
    }
    break;
  case 0x26:
    _mod = (char *)(CONCAT44(uVar9,(uint)*(byte *)&num[6].super_ScheduleStrategy.grow) &
                   0xffffffff00000003);
    Potassco::string_cast<Clasp::SolverStrategies::SignHeu>((string *)&str,&mod.val);
    break;
  case 0x27:
    Potassco::string_cast<float>((string *)&str,(float *)&num[6].super_ScheduleStrategy.idx);
    break;
  case 0x28:
    uVar14 = *(uint *)&num[6].super_ScheduleStrategy;
    if ((uVar14 & 0xffff) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar14) & 0xffffffff0000ffff);
      pick.val = uVar14 >> 0x10;
      Potassco::toString<unsigned_int,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(ulong)(uVar14 & 0xffff));
    }
    break;
  case 0x29:
    Potassco::string_cast<Clasp::RestartSchedule>((string *)&str,num);
    break;
  case 0x2a:
    uVar7 = num[1].super_ScheduleStrategy.grow;
    _mod = (char *)(CONCAT44(uVar9,(uint)uVar7 >> 0x1c) & 0xffffffff00000003);
    Potassco::string_cast<Clasp::RestartParams::SeqUpdate>((string *)&str,&mod.val);
    break;
  case 0x2b:
    uVar8 = num[1].super_ScheduleStrategy.grow;
    _mod = (char *)(CONCAT44(uVar9,(uint)uVar8 >> 0x1e) & 0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x2c:
    uVar4._0_4_ = num[1].super_ScheduleStrategy.len;
    uVar4._4_4_ = num[1].super_ScheduleStrategy.grow;
    if ((short)(undefined4)uVar4 == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)CONCAT44(uVar9,(int)(uint *)(uVar4 & 0xffff));
      pick.val = (uint)(uVar4 >> 0x10) & 0xffff;
      Potassco::toString<unsigned_int,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(uVar4 & 0xffff));
    }
    break;
  case 0x2d:
    if ((*(ulong *)&num[1].super_ScheduleStrategy & 0x7fffff) == 0) {
      Potassco::operator<<(&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,(int)*(ulong *)&num[1].super_ScheduleStrategy) &
                     0xffffffff007fffff);
      pSVar13 = Potassco::operator<<(&str,&mod.val);
      pick.val = (uint)((float)(*(uint *)&num[1].super_ScheduleStrategy >> 0x17) / 100.0);
      pSVar13 = Potassco::operator<<(pSVar13,(float *)&pick);
      local_38 = num[1].super_ScheduleStrategy.idx & 0x1fffffff;
      pSVar13 = Potassco::operator<<(pSVar13,&local_38);
      local_34 = (Type)((ulong)*(undefined8 *)&num[1].super_ScheduleStrategy >> 0x3d);
      Potassco::operator<<(pSVar13,&local_34);
    }
    goto LAB_001208fb;
  case 0x2e:
    uVar12._0_4_ = num[1].super_ScheduleStrategy.len;
    uVar12._4_4_ = num[1].super_ScheduleStrategy.grow;
    if ((uVar12 & 0x3fff00000000) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar12._4_4_) & 0xffffffff00003fff);
      pick.val = (uint)uVar12._4_4_ >> 0xe & 0x3fff;
      Potassco::toString<unsigned_int,unsigned_int>
                ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(ulong)(uVar12._4_4_ & 0x3fff));
    }
    break;
  case 0x2f:
    uVar14 = *(uint *)&num[4].super_ScheduleStrategy;
    if ((uVar14 & 0x3f800) == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)(CONCAT44(uVar9,uVar14 >> 0x1b) & 0xffffffff00000003);
      pick.val = uVar14 >> 0xb & 0x7f;
      local_38 = uVar14 >> 0x19 & 3;
      Potassco::toString<Clasp::ReduceStrategy::Algorithm,unsigned_int,Clasp::ReduceStrategy::Score>
                ((string *)&str,(Potassco *)&mod,&pick.val,&local_38,(Score *)in_R8);
    }
    break;
  case 0x30:
    fVar1 = num[4].super_ScheduleStrategy.grow;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      pSVar13 = Potassco::operator<<(&str,&num[4].super_ScheduleStrategy.grow);
      Potassco::operator<<(pSVar13,(float *)&num[4].super_ScheduleStrategy.len);
      if (((undefined1  [16])num[3].super_ScheduleStrategy & (undefined1  [16])0x3fffffff) !=
          (undefined1  [16])0x0) {
        Potassco::operator<<(&str,&num[3].super_ScheduleStrategy);
      }
    }
    else {
      Potassco::operator<<(&str,(OffType *)&Potassco::off);
    }
    goto LAB_001208fb;
  case 0x31:
    Potassco::string_cast<Clasp::ScheduleStrategy>((string *)&str,&num[2].super_ScheduleStrategy);
    break;
  case 0x32:
    fVar1 = (float)num[4].super_ScheduleStrategy.idx;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      _mod = (char *)(1.0 / (double)fVar1);
      pick.val = num[5].super_ScheduleStrategy.idx - *(int *)&num[5].super_ScheduleStrategy;
      Potassco::toString<double,unsigned_int,unsigned_int>
                ((string *)&str,(Potassco *)&mod,(double *)(num + 5),&pick.val,(uint *)in_R8);
    }
    else {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    break;
  case 0x33:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&num[4].super_ScheduleStrategy >> 0x1d) &
                   0xffffffff00000003);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x34:
    Potassco::toString<unsigned_int,unsigned_int>
              ((string *)&str,(Potassco *)&num[5].super_ScheduleStrategy.len,
               (uint *)&num[5].super_ScheduleStrategy.grow,&switchD_0011fb21::switchdataD_001972e4);
    break;
  case 0x35:
    uVar14 = *(uint *)&num[4].super_ScheduleStrategy >> 7;
    _mod = (char *)(CONCAT44(uVar9,uVar14) & 0xffffffff0000000f);
    pick.val = *(uint *)&num[4].super_ScheduleStrategy >> 0x1f;
    Potassco::toString<unsigned_int,unsigned_int>
              ((string *)&str,(Potassco *)&mod,&pick.val,(uint *)(ulong)(uVar14 & 0xf));
    break;
  case 0x36:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&num[4].super_ScheduleStrategy >> 0x12) &
                   0xffffffff0000007f);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x37:
    _mod = (char *)CONCAT44(uVar9,(this->super_ClaspConfig).asp.erMode);
    Potassco::string_cast<Clasp::Asp::LogicProgram::ExtendedRuleMode>((string *)&str,&mod.val);
    break;
  case 0x38:
    _mod = (char *)(CONCAT44(uVar9,*(undefined4 *)&(this->super_ClaspConfig).asp.field_0x4) &
                   0xffffffff03ffffff);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x39:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1d) &
                   0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x3a:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1b) &
                   0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x3b:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1a) &
                   0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x3c:
    _mod = (char *)CONCAT44(uVar9,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1f);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x3d:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1c) &
                   0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x3e:
    _mod = (char *)(CONCAT44(uVar9,*(uint *)&(this->super_ClaspConfig).asp.field_0x4 >> 0x1e) &
                   0xffffffff00000001);
    Potassco::string_cast<unsigned_int>((string *)&str,&mod.val);
    break;
  case 0x3f:
    uVar12 = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.super_BasicSolveOptions.
             limit.conflicts;
    if (0xfffffffe < uVar12) {
      uVar12 = 0xffffffff;
    }
    _mod = (char *)CONCAT44(uVar9,(int)uVar12);
    puVar6 = (uint *)(this->super_ClaspConfig).solve.super_ParallelSolveOptions.
                     super_BasicSolveOptions.limit.restarts;
    y = (uint *)0xffffffff;
    if (puVar6 < (uint *)0xffffffff) {
      y = puVar6;
    }
    pick.val = (uint)y;
    Potassco::toString<unsigned_int,unsigned_int>((string *)&str,(Potassco *)&mod,&pick.val,y);
    break;
  case 0x40:
    _mod = (char *)CONCAT44(uVar9,(this->super_ClaspConfig).solve.super_ParallelSolveOptions.
                                  algorithm.mode);
    Potassco::toString<unsigned_int,Clasp::mt::ParallelSolveOptions::Algorithm::SearchMode>
              ((string *)&str,
               (Potassco *)&(this->super_ClaspConfig).solve.super_ParallelSolveOptions.algorithm,
               &mod.val,&switchD_0011fb21::switchdataD_001972e4);
    break;
  case 0x41:
    if ((this->super_ClaspConfig).solve.super_ParallelSolveOptions.restarts.maxR == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      Potassco::toString<unsigned_int,Clasp::ScheduleStrategy>
                ((string *)&str,
                 (Potassco *)&(this->super_ClaspConfig).solve.super_ParallelSolveOptions.restarts,
                 (uint *)&(this->super_ClaspConfig).solve.super_ParallelSolveOptions.restarts.sched,
                 (ScheduleStrategy *)&switchD_0011fb21::switchdataD_001972e4);
    }
    break;
  case 0x42:
    PVar3 = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.super_Policy;
    if ((uint)PVar3 < 0x20000000) {
      Potassco::operator<<(&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)CONCAT44(uVar9,(uint)PVar3 >> 0x1d);
      pSVar13 = Potassco::operator<<(&str,&mod.val);
      pick.val = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.mode;
      pSVar13 = Potassco::operator<<(pSVar13,&pick.val);
      local_38 = (uint)(this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.
                       super_Policy >> 0x16 & 0x7f;
      pSVar13 = Potassco::operator<<(pSVar13,&local_38);
      local_34 = (uint)(this->super_ClaspConfig).solve.super_ParallelSolveOptions.distribute.
                       super_Policy & 0x3fffff;
      Potassco::operator<<(pSVar13,&local_34);
    }
    goto LAB_001208fb;
  case 0x43:
    IVar2 = (this->super_ClaspConfig).solve.super_ParallelSolveOptions.integrate;
    _mod = (char *)(CONCAT44(uVar9,(uint)IVar2 >> 0x1c) & 0xffffffff00000003);
    pick.val = (uint)IVar2 & 0xfffffff;
    local_38 = (uint)IVar2 >> 0x1e;
    Potassco::
    toString<Clasp::mt::ParallelSolveOptions::Integration::Filter,unsigned_int,Clasp::mt::ParallelSolveOptions::Integration::Topology>
              ((string *)&str,(Potassco *)&mod,&pick.val,&local_38,(Topology *)in_R8);
    break;
  case 0x44:
    Potassco::string_cast<Clasp::EnumOptions::EnumType>
              ((string *)&str,&(this->super_ClaspConfig).solve.super_EnumOptions.enumMode);
    break;
  case 0x45:
    uVar14 = (this->super_ClaspConfig).solve.super_EnumOptions.project;
    if (uVar14 == 0) {
      Potassco::string_cast<Potassco::OffType>((string *)&str,(OffType *)&Potassco::off);
    }
    else {
      _mod = (char *)CONCAT44(uVar9,uVar14 >> 1);
      Potassco::toString<Clasp::ProjectMode_t::Mode,unsigned_int>
                ((string *)&str,
                 (Potassco *)&(this->super_ClaspConfig).solve.super_EnumOptions.proMode,&mod.val,
                 &switchD_0011fb21::switchdataD_001972e4);
    }
    break;
  case 0x46:
    Potassco::string_cast<long>
              ((string *)&str,&(this->super_ClaspConfig).solve.super_EnumOptions.numModels);
    break;
  case 0x47:
    Potassco::operator<<(&str,&(this->super_ClaspConfig).solve.super_EnumOptions.optMode);
    if ((this->super_ClaspConfig).solve.super_EnumOptions.optBound.ebo_.size != 0) {
      Potassco::operator<<(&str,&(this->super_ClaspConfig).solve.super_EnumOptions.optBound);
    }
    goto LAB_001208fb;
  case 0x48:
    if ((this->super_ClaspConfig).solve.super_EnumOptions.optStop.ebo_.size == 0) {
      Potassco::operator<<(&str,(OffType *)&Potassco::off);
    }
    else {
      Potassco::operator<<(&str,&(this->super_ClaspConfig).solve.super_EnumOptions.optStop);
    }
    goto LAB_001208fb;
  default:
    Potassco::fail(-1,"int Clasp::Cli::ClaspCliConfig::getValue(KeyType, std::string &) const",0x3b2
                   ,"false","invalid option",0);
  }
  std::__cxx11::string::operator=((string *)out,(string *)&str);
  std::__cxx11::string::~string((string *)&str);
LAB_001208fb:
  return (int)out->_M_string_length;
}

Assistant:

int ClaspCliConfig::getValue(KeyType key, std::string& out) const {
	try {
		const UserConfig* base = active(this, decodeMode(key));
		int16 o = decodeKey(key);
		int   r = isLeafId(o) && base ? 1 : -1;
		if (r > 0 && isOption(o)) {
			POTASSCO_ASSERT(base == this || isTesterOption(o));
			uint32 sId = decodeSolver(key);
			const SolverParams* solver = &base->solver(sId);
			const SolveParams*  search = &base->search(sId);
			// helper macros used in get
			using Potassco::toString; using Potassco::off; using Potassco::Set;
			#define GET_FUN(x)     Potassco::StringRef x(out); if (!x.out);else
			#define GET(...)       out = toString( __VA_ARGS__ )
			#define GET_IF(c, ...) out = ITE((c), toString(__VA_ARGS__), toString(off))
			switch(static_cast<OptionKey>(o)) {
				default: POTASSCO_ASSERT(false, "invalid option");
				#define OPTION(k, e, a, h, _, GET) case opt_##k: { GET ; } break;
				#define CLASP_ALL_GROUPS
				#include <clasp/cli/clasp_cli_options.inl>
			}
			#undef GET_FUN
			#undef GET
			#undef GET_IF
		}
		else if (r > 0 && o == meta_config) {
			if (base->cliConfig < config_max_value) { xconvert(out, static_cast<ConfigKey>(base->cliConfig)); }
			else                                    { out.append(config_[base == testerConfig()]); }
		}
		return r > 0 ? static_cast<int>(out.length()) : r;
	}
	catch (...) { return -2; }
}